

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O3

int run_test_loop_update_time(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uv_loop_t *loop;
  undefined1 auStack_b8 [160];
  
  auStack_b8._152_8_ = 0x16159a;
  puVar2 = uv_default_loop();
  auStack_b8._152_8_ = 0x1615a2;
  uVar3 = uv_now(puVar2);
  do {
    auStack_b8._152_8_ = 0x1615aa;
    puVar2 = uv_default_loop();
    auStack_b8._152_8_ = 0x1615b2;
    uVar4 = uv_now(puVar2);
    auStack_b8._152_8_ = 0x1615bd;
    puVar2 = uv_default_loop();
    if (999 < uVar4 - uVar3) goto LAB_001615df;
    auStack_b8._152_8_ = 0x1615d6;
    iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
  } while (iVar1 == 0);
  auStack_b8._152_8_ = 0x1615df;
  run_test_loop_update_time_cold_2();
LAB_001615df:
  auStack_b8._152_8_ = 0x1615f0;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  auStack_b8._152_8_ = 0x1615fa;
  uv_run(puVar2,UV_RUN_DEFAULT);
  auStack_b8._152_8_ = 0x1615ff;
  puVar2 = uv_default_loop();
  auStack_b8._152_8_ = 0x161607;
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  auStack_b8._152_8_ = run_test_loop_backend_timeout;
  run_test_loop_update_time_cold_1();
  auStack_b8._152_8_ = uVar3;
  loop = uv_default_loop();
  puVar2 = loop;
  iVar1 = uv_timer_init(loop,(uv_timer_t *)auStack_b8);
  if (iVar1 == 0) {
    puVar2 = loop;
    iVar1 = uv_loop_alive(loop);
    if (iVar1 != 0) goto LAB_001616f7;
    puVar2 = loop;
    iVar1 = uv_backend_timeout(loop);
    if (iVar1 != 0) goto LAB_001616fc;
    puVar2 = (uv_loop_t *)auStack_b8;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,cb,1000,0);
    if (iVar1 != 0) goto LAB_00161701;
    puVar2 = loop;
    iVar1 = uv_backend_timeout(loop);
    if (iVar1 < 0x65) goto LAB_00161706;
    puVar2 = loop;
    iVar1 = uv_backend_timeout(loop);
    if (1000 < iVar1) goto LAB_0016170b;
    puVar2 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00161710;
    iVar1 = uv_backend_timeout(loop);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016171a;
    }
  }
  else {
    run_test_loop_backend_timeout_cold_1();
LAB_001616f7:
    run_test_loop_backend_timeout_cold_2();
LAB_001616fc:
    run_test_loop_backend_timeout_cold_3();
LAB_00161701:
    run_test_loop_backend_timeout_cold_4();
LAB_00161706:
    run_test_loop_backend_timeout_cold_5();
LAB_0016170b:
    run_test_loop_backend_timeout_cold_6();
LAB_00161710:
    loop = puVar2;
    run_test_loop_backend_timeout_cold_7();
  }
  run_test_loop_backend_timeout_cold_8();
LAB_0016171a:
  run_test_loop_backend_timeout_cold_9();
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(loop_update_time) {
  uint64_t start;

  start = uv_now(uv_default_loop());
  while (uv_now(uv_default_loop()) - start < 1000)
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}